

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O3

tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
* __thiscall
polyscope::CameraExtrinsics::getCameraFrame
          (tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
           *__return_storage_ptr__,CameraExtrinsics *this)

{
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  _Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  *p_Var11;
  long lVar12;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *paVar13;
  undefined1 auVar14 [16];
  undefined8 uStack_2c;
  mat3x3 R;
  
  paVar13 = &(this->E).value[0].field_2;
  lVar12 = 8;
  do {
    *(undefined8 *)((long)&uStack_2c + lVar12) = *(undefined8 *)(paVar13 + -2);
    aVar1 = *paVar13;
    paVar13 = paVar13 + 4;
    *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)
     ((long)&R.value[0].field_0 + lVar12) = aVar1;
    lVar12 = lVar12 + 0xc;
  } while (lVar12 != 0x2c);
  auVar14 = ZEXT816(0) << 0x40;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)R.value[0].field_1),ZEXT416((uint)R.value[0].field_0),
                           auVar14);
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)R.value[1].field_1),ZEXT416((uint)R.value[1].field_0),
                           auVar14);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)R.value[2].field_1),ZEXT416((uint)R.value[2].field_0),
                           auVar14);
  auVar3 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)R.value[0].field_0),
                           ZEXT416((uint)(R.value[0].field_1.y * 0.0)));
  auVar4 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)R.value[1].field_0),
                           ZEXT416((uint)(R.value[1].field_1.y * 0.0)));
  auVar5 = vfmadd213ss_fma(ZEXT816(0) << 0x40,ZEXT416((uint)R.value[2].field_0),
                           ZEXT416((uint)(R.value[2].field_1.y * 0.0)));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)R.value[0].field_2),auVar14);
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)R.value[1].field_2),auVar14);
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)R.value[2].field_2),auVar14);
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(R.value[0].field_1.y * 0.0 + R.value[0].field_0.x)),
                           auVar14,ZEXT416((uint)R.value[0].field_2));
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(R.value[1].field_1.y * 0.0 + R.value[1].field_0.x)),
                            auVar14,ZEXT416((uint)R.value[1].field_2));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(R.value[2].field_1.y * 0.0 + R.value[2].field_0.x)),
                            ZEXT416((uint)R.value[2].field_2),auVar14);
  auVar6 = vinsertps_avx(auVar6,auVar7,0x10);
  auVar7 = vinsertps_avx(auVar9,auVar10,0x10);
  auVar3 = vinsertps_avx(ZEXT416((uint)(auVar3._0_4_ - R.value[0].field_2.z)),
                         ZEXT416((uint)(auVar4._0_4_ - R.value[1].field_2.z)),0x10);
  uVar2 = vmovlps_avx(auVar7);
  p_Var11 = &(__return_storage_ptr__->
             super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
             ).
             super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ;
  (p_Var11->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar2;
  (p_Var11->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).
  super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
       auVar14._0_4_;
  uVar2 = vmovlps_avx(auVar6);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).
  super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar2;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).
  super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).
  super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
       auVar8._0_4_;
  uVar2 = vmovlps_avx(auVar3);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar2;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2.z =
       auVar5._0_4_ - R.value[2].field_2.z;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<glm::vec3, glm::vec3, glm::vec3> CameraExtrinsics::getCameraFrame() const {

  glm::mat3x3 R;
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 3; j++) {
      R[i][j] = E[i][j];
    }
  }
  glm::mat3x3 Rt = glm::transpose(R);

  glm::vec3 lookDir = Rt * glm::vec3(0.0, 0.0, -1.0);
  glm::vec3 upDir = Rt * glm::vec3(0.0, 1.0, 0.0);
  glm::vec3 rightDir = Rt * glm::vec3(1.0, 0.0, 0.0);

  return std::tuple<glm::vec3, glm::vec3, glm::vec3>{lookDir, upDir, rightDir};
}